

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O3

void msd_CE6(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  long *__ptr;
  size_t sVar4;
  long lVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  size_t i_2;
  long lVar8;
  
  if (n < 0x10000) {
    msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
    return;
  }
  uVar3 = 0;
  if ((n & 0xfffffffffffffffe) != 0) {
    do {
      puVar1 = strings[uVar3];
      if (puVar1 == (uchar *)0x0) goto LAB_00202b8e;
      if (puVar1[depth] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      puVar1 = strings[uVar3 + 1];
      if (puVar1 == (uchar *)0x0) goto LAB_00202b8e;
      if (puVar1[depth] == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      oracle[uVar3] = uVar6;
      oracle[uVar3 + 1] = uVar7;
      uVar3 = uVar3 + 2;
    } while (uVar3 < (n & 0xfffffffffffffffe));
  }
  if (uVar3 < n) {
    do {
      puVar1 = strings[uVar3];
      if (puVar1 == (uchar *)0x0) {
LAB_00202b8e:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      oracle[uVar3] = uVar6;
      uVar3 = uVar3 + 1;
    } while (n != uVar3);
  }
  __ptr = (long *)calloc(0x10000,8);
  sVar4 = 0;
  do {
    __ptr[oracle[sVar4]] = __ptr[oracle[sVar4]] + 1;
    sVar4 = sVar4 + 1;
  } while (n != sVar4);
  msd_CE6::bucketindex[0] = 0;
  lVar5 = 0;
  sVar4 = 0;
  do {
    sVar4 = sVar4 + __ptr[lVar5];
    msd_CE6::bucketindex[lVar5 + 1] = sVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xffff);
  sVar4 = 0;
  do {
    puVar1 = strings[sVar4];
    sVar2 = msd_CE6::bucketindex[oracle[sVar4]];
    msd_CE6::bucketindex[oracle[sVar4]] = sVar2 + 1;
    sorted[sVar2] = puVar1;
    sVar4 = sVar4 + 1;
  } while (n != sVar4);
  memcpy(strings,sorted,n << 3);
  lVar5 = *__ptr;
  lVar8 = 1;
  do {
    sVar4 = __ptr[lVar8];
    if (sVar4 != 0) {
      if ((char)lVar8 != '\0') {
        msd_CE6(strings + lVar5,sVar4,depth + 2,oracle,sorted);
      }
      lVar5 = lVar5 + sVar4;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_CE6(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth, (unsigned char*)oracle, sorted);
		return;
	}
	{
		size_t i;
		for (i=0; i < n-n%2; i+=2) {
			unsigned char* str1 = strings[i];
			unsigned char* str2 = strings[i+1];
			uint16_t ch1 = get_char<uint16_t>(str1, depth);
			uint16_t ch2 = get_char<uint16_t>(str2, depth);
			oracle[i] = ch1;
			oracle[i+1] = ch2;
		}
		for (; i < n; ++i)
			oracle[i] = get_char<uint16_t>(strings[i], depth);
	}
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE6(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}